

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall value_none::test_method(value_none *this)

{
  undefined1 uVar1;
  size_t sVar2;
  Value value1;
  Value value;
  char *local_278;
  char *local_270;
  shared_count local_268;
  undefined **local_260;
  ulong local_258;
  shared_count sStack_250;
  char **local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  output_test_stream output;
  
  dynamicgraph::command::Value::Value(&value1);
  dynamicgraph::command::Value::Value(&value,&value1);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x20);
  uVar1 = dynamicgraph::command::Value::operator==(&value1,&value);
  local_260 = (undefined **)(CONCAT71(local_260._1_7_,uVar1) ^ 1);
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_278 = "!(value1 == value)";
  local_270 = "";
  _output = &PTR__lazy_ostream_00112c30;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1d8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_250);
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_1f0,1);
  dynamicgraph::command::operator<<((ostream *)&output,&value1);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x25);
  local_220 = "Type=unknown, value=";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("Type=unknown, value=");
  local_218 = "Type=unknown, value=" + sVar2;
  boost::test_tools::output_test_stream::is_equal(&local_278,&output,&local_220,1);
  local_248 = &local_230;
  local_230 = "output.is_equal(\"Type=unknown, value=\")";
  local_228 = "";
  local_258 = local_258 & 0xffffffffffffff00;
  local_260 = &PTR__lazy_ostream_00112c30;
  sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_238 = "";
  boost::test_tools::tt_detail::report_assertion(&local_278,&local_260,&local_240,0x25,1,0,0);
  boost::detail::shared_count::~shared_count(&local_268);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  dynamicgraph::command::Value::~Value(&value);
  dynamicgraph::command::Value::~Value(&value1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_none) {
  using dg::command::Value;

  Value value1;
  Value value(value1);

  // Similar to NaN != NaN
  BOOST_CHECK(!(value1 == value));

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(output.is_equal("Type=unknown, value="));
  }
}